

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDCircles.cpp
# Opt level: O1

void __thiscall EDCircles::JoinArcs2(EDCircles *this)

{
  int *piVar1;
  MyArc *__src;
  int iVar2;
  int ey;
  int iVar3;
  MyArc *pMVar4;
  BufferManager *pBVar5;
  EDArcs *pEVar6;
  Circle *pCVar7;
  bool bVar8;
  bool bVar9;
  void *__s;
  void *pvVar10;
  long lVar11;
  undefined8 *puVar12;
  bool bVar13;
  int iVar14;
  undefined4 *puVar15;
  int ex;
  size_t sVar16;
  ulong uVar17;
  double *x;
  uint uVar18;
  size_t __n;
  double *y;
  size_t sVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  int local_2378;
  int local_2374;
  ulong local_2370;
  ulong local_2360;
  ulong local_2350;
  double local_2330;
  double local_22e8;
  size_t local_22d8;
  double R;
  double YC;
  double XC;
  undefined4 *local_22a8;
  ulong local_22a0;
  ulong local_2298;
  long local_2290;
  double CircleFitError;
  double eTheta;
  EllipseEquation eq;
  EllipseEquation Eq;
  AngleSet angles;
  
  angles.head = -1;
  angles.next = 0;
  angles.overlapAmount = 0.0;
  sortArc(this->edarcs2->arcs,this->edarcs2->noArcs);
  iVar2 = this->edarcs2->noArcs;
  __n = (size_t)iVar2;
  pMVar4 = this->edarcs2->arcs;
  sVar16 = __n;
  if ((long)__n < 0) {
    sVar16 = 0xffffffffffffffff;
  }
  __s = operator_new__(sVar16);
  if (0 < (long)__n) {
    memset(__s,0,__n);
  }
  uVar17 = __n << 4;
  if (iVar2 < 0) {
    uVar17 = 0xffffffffffffffff;
  }
  pvVar10 = operator_new__(uVar17);
  if (0 < iVar2) {
    local_22a8 = (undefined4 *)((long)pvVar10 + 4);
    local_22d8 = 1;
    sVar16 = 0;
    do {
      if (*(char *)((long)__s + sVar16) == '\0') {
        Eq.coeff[4] = 0.0;
        Eq.coeff[5] = 0.0;
        Eq.coeff[2] = 0.0;
        Eq.coeff[3] = 0.0;
        Eq.coeff[0] = 0.0;
        Eq.coeff[1] = 0.0;
        Eq.coeff[6] = 0.0;
        __src = pMVar4 + sVar16;
        local_22e8 = pMVar4[sVar16].r;
        local_2378 = pMVar4[sVar16].turn;
        local_2360 = (ulong)pMVar4[sVar16].noPixels;
        local_2374 = pMVar4[sVar16].sx;
        iVar2 = pMVar4[sVar16].sy;
        ex = pMVar4[sVar16].ex;
        pBVar5 = this->bm;
        x = pBVar5->x + pBVar5->index;
        y = pBVar5->y + pBVar5->index;
        ey = pMVar4[sVar16].ey;
        memcpy(x,pMVar4[sVar16].x,local_2360 << 3);
        memcpy(y,pMVar4[sVar16].y,local_2360 << 3);
        angles.head = -1;
        angles.next = 0;
        bVar9 = false;
        angles.overlapAmount = 0.0;
        AngleSet::set(&angles,pMVar4[sVar16].sTheta,pMVar4[sVar16].eTheta);
        local_22a0 = sVar16 + 1;
        local_2350 = local_2360;
        do {
          uVar18 = 0;
          if (local_22a0 < __n) {
            uVar18 = 0;
            sVar19 = local_22d8;
            do {
              if (((*(char *)((long)__s + sVar19) == '\0') &&
                  (pMVar4[sVar19].segmentNo == __src->segmentNo)) &&
                 (pMVar4[sVar19].turn == local_2378)) {
                dVar25 = pMVar4[sVar19].r;
                uVar20 = SUB84(dVar25,0);
                uVar21 = (undefined4)((ulong)dVar25 >> 0x20);
                if (local_22e8 <= dVar25) {
                  uVar20 = SUB84(local_22e8,0);
                  uVar21 = (undefined4)((ulong)local_22e8 >> 0x20);
                }
                if ((ABS(local_22e8 - dVar25) <= (double)CONCAT44(uVar21,uVar20) * 2.5) &&
                   (dVar25 = AngleSet::overlap(&angles,pMVar4[sVar19].sTheta,pMVar4[sVar19].eTheta),
                   dVar25 < 0.75)) {
                  dVar25 = (double)(local_2374 - pMVar4[sVar19].sx);
                  dVar23 = (double)(iVar2 - pMVar4[sVar19].sy);
                  dVar25 = dVar25 * dVar25 + dVar23 * dVar23;
                  if (dVar25 < 0.0) {
                    dVar25 = sqrt(dVar25);
                  }
                  else {
                    dVar25 = SQRT(dVar25);
                  }
                  dVar23 = (double)(local_2374 - pMVar4[sVar19].ex);
                  dVar26 = (double)(iVar2 - pMVar4[sVar19].ey);
                  dVar23 = dVar23 * dVar23 + dVar26 * dVar26;
                  if (dVar23 < 0.0) {
                    dVar23 = sqrt(dVar23);
                  }
                  else {
                    dVar23 = SQRT(dVar23);
                  }
                  dVar26 = (double)(ex - pMVar4[sVar19].sx);
                  dVar24 = (double)(ey - pMVar4[sVar19].sy);
                  dVar26 = dVar26 * dVar26 + dVar24 * dVar24;
                  if (dVar26 < 0.0) {
                    dVar26 = sqrt(dVar26);
                  }
                  else {
                    dVar26 = SQRT(dVar26);
                  }
                  dVar24 = dVar23;
                  if (dVar25 <= dVar23) {
                    dVar24 = dVar25;
                  }
                  iVar14 = (dVar23 < dVar25) + 1;
                  if (dVar26 < dVar24) {
                    iVar14 = 3;
                  }
                  dVar25 = (double)(ex - pMVar4[sVar19].ex);
                  dVar23 = (double)(ey - pMVar4[sVar19].ey);
                  dVar25 = dVar25 * dVar25 + dVar23 * dVar23;
                  if (dVar25 < 0.0) {
                    dVar25 = sqrt(dVar25);
                  }
                  else {
                    dVar25 = SQRT(dVar25);
                  }
                  if (dVar24 <= dVar26) {
                    dVar26 = dVar24;
                  }
                  if (dVar25 < dVar26) {
                    iVar14 = 4;
                    dVar26 = dVar25;
                  }
                  if (dVar26 <= 5.0) {
                    uVar17 = (ulong)uVar18;
                    if (0 < (int)uVar18) {
                      uVar17 = (ulong)uVar18;
                      puVar12 = (undefined8 *)((ulong)uVar18 * 0x10 + (long)pvVar10);
                      do {
                        if ((double)puVar12[-1] <= dVar26 && dVar26 != (double)puVar12[-1])
                        goto LAB_0010ce69;
                        *puVar12 = puVar12[-2];
                        puVar12[1] = puVar12[-1];
                        bVar13 = 1 < (long)uVar17;
                        uVar17 = uVar17 - 1;
                        puVar12 = puVar12 + -2;
                      } while (bVar13);
                      uVar17 = 0;
                    }
LAB_0010ce69:
                    lVar11 = (long)(int)uVar17 * 0x10;
                    *(int *)((long)pvVar10 + lVar11) = (int)sVar19;
                    *(int *)((long)pvVar10 + lVar11 + 4) = iVar14;
                    *(double *)((long)pvVar10 + lVar11 + 8) = dVar26;
                    uVar18 = uVar18 + 1;
                  }
                }
              }
              sVar19 = sVar19 + 1;
            } while (sVar19 != __n);
          }
          if ((int)uVar18 < 1) {
            bVar13 = true;
          }
          else {
            local_2298 = (ulong)uVar18;
            local_2370 = 1;
            bVar13 = false;
            puVar15 = local_22a8;
            do {
              lVar11 = (long)(int)puVar15[-1];
              uVar20 = *puVar15;
              local_2290 = lVar11;
              memcpy(x + (int)local_2350,pMVar4[lVar11].x,(long)pMVar4[lVar11].noPixels << 3);
              memcpy(y + (int)local_2350,pMVar4[lVar11].y,(long)pMVar4[lVar11].noPixels << 3);
              uVar18 = (int)local_2350 + pMVar4[lVar11].noPixels;
              eq.coeff[4] = 0.0;
              eq.coeff[5] = 0.0;
              eq.coeff[2] = 0.0;
              eq.coeff[3] = 0.0;
              eq.coeff[0] = 0.0;
              eq.coeff[1] = 0.0;
              eq.coeff[6] = 0.0;
              bVar8 = EllipseFit(x,y,uVar18,&eq,1);
              uVar21 = 0x20000000;
              uVar22 = 0x4202a05f;
              if (bVar8) {
                dVar25 = ComputeEllipseError(&eq,x,y,uVar18);
                uVar21 = SUB84(dVar25,0);
                uVar22 = (undefined4)((ulong)dVar25 >> 0x20);
              }
              if (1.5 <= (double)CONCAT44(uVar22,uVar21) && (double)CONCAT44(uVar22,uVar21) != 1.5)
              goto LAB_0010d116;
              Eq.coeff[6] = eq.coeff[6];
              Eq.coeff[4] = eq.coeff[4];
              Eq.coeff[5] = eq.coeff[5];
              Eq.coeff[2] = eq.coeff[2];
              Eq.coeff[3] = eq.coeff[3];
              Eq.coeff[0] = eq.coeff[0];
              Eq.coeff[1] = eq.coeff[1];
              *(undefined1 *)((long)__s + local_2290) = 1;
              bVar13 = true;
              *(undefined1 *)((long)__s + sVar16) = 1;
              local_22e8 = (local_22e8 + pMVar4[lVar11].r) * 0.5;
              AngleSet::set(&angles,pMVar4[lVar11].sTheta,pMVar4[lVar11].eTheta);
              iVar3 = ex;
              iVar14 = ey;
              switch(uVar20) {
              case 1:
                iVar3 = pMVar4[lVar11].ex;
                iVar14 = pMVar4[lVar11].ey;
                goto LAB_0010d0df;
              case 2:
                iVar3 = pMVar4[lVar11].sx;
                iVar14 = pMVar4[lVar11].sy;
LAB_0010d0df:
                local_2378 = ((local_2378 != 1) - 1) + (uint)(local_2378 != 1);
                local_2374 = ex;
                iVar2 = ey;
                break;
              case 3:
                iVar3 = pMVar4[lVar11].ex;
                iVar14 = pMVar4[lVar11].ey;
                break;
              case 4:
                iVar3 = pMVar4[lVar11].sx;
                iVar14 = pMVar4[lVar11].sy;
              }
              local_2350 = (ulong)uVar18;
              local_2330 = (double)CONCAT44(uVar22,uVar21);
              bVar9 = true;
              ex = iVar3;
              local_2360 = (ulong)uVar18;
              ey = iVar14;
LAB_0010d116:
              if ((double)CONCAT44(uVar22,uVar21) < 1.5 || (double)CONCAT44(uVar22,uVar21) == 1.5)
              break;
              puVar15 = puVar15 + 4;
              bVar8 = local_2370 < local_2298;
              local_2370 = local_2370 + 1;
            } while (bVar8);
            bVar13 = !bVar13;
          }
        } while (!bVar13);
        if (bVar9) {
          AngleSet::computeStartEndTheta(&angles,eq.coeff,&eTheta);
          iVar14 = (int)local_2360;
          CircleFit(x,y,iVar14,&XC,&YC,&R,&CircleFitError);
          if ((((double)(-(ulong)(eq.coeff[0] < eTheta) & (ulong)-eq.coeff[0] |
                        ~-(ulong)(eq.coeff[0] < eTheta) & (ulong)(6.283185307179586 - eq.coeff[0]))
               + eTheta) / 6.283185307179586 < 0.67) || (1.5 < CircleFitError)) {
            addArc(this->edarcs3->arcs,&this->edarcs3->noArcs,XC,YC,R,CircleFitError,eq.coeff[0],
                   eTheta,local_2378,__src->segmentNo,&Eq,local_2330,local_2374,iVar2,ex,ey,x,y,
                   iVar14,angles.overlapAmount / 6.283185307179586);
          }
          else {
            pCVar7 = this->circles1;
            iVar2 = this->noCircles1;
            pCVar7[iVar2].xc = XC;
            pCVar7[iVar2].yc = YC;
            pCVar7[iVar2].r = R;
            pCVar7[iVar2].circleFitError = CircleFitError;
            pCVar7[iVar2].coverRatio = (double)iVar14 / (R * 6.283185307179586);
            pCVar7[iVar2].x = x;
            pCVar7[iVar2].y = y;
            pCVar7[iVar2].noPixels = iVar14;
            iVar2 = this->noCircles1;
            pCVar7[iVar2].isEllipse = false;
            this->noCircles1 = iVar2 + 1;
          }
          piVar1 = &this->bm->index;
          *piVar1 = *piVar1 + iVar14;
        }
        else {
          pEVar6 = this->edarcs3;
          iVar2 = pEVar6->noArcs;
          pEVar6->noArcs = iVar2 + 1;
          memcpy(pEVar6->arcs + iVar2,__src,0xa8);
        }
      }
      sVar16 = sVar16 + 1;
      local_22d8 = local_22d8 + 1;
    } while (sVar16 != __n);
  }
  operator_delete__(__s);
  operator_delete__(pvVar10);
  return;
}

Assistant:

void EDCircles::JoinArcs2()
{
	AngleSet angles;

	// Sort the arcs with respect to their length so that longer arcs are at the beginning
	sortArc(edarcs2->arcs, edarcs2->noArcs);

	int noArcs = edarcs2->noArcs;
	MyArc *arcs = edarcs2->arcs;

	bool *taken = new bool[noArcs];
	for (int i = 0; i<noArcs; i++) taken[i] = false;

	struct CandidateArc {
		int arcNo;
		int which;    // 1: (SX, SY)-(sx, sy), 2: (SX, SY)-(ex, ey), 3: (EX, EY)-(sx, sy), 4: (EX, EY)-(ex, ey)
		double dist;  // min distance between the end points
	};

	CandidateArc *candidateArcs = new CandidateArc[noArcs];
	int noCandidateArcs;

	for (int i = 0; i<noArcs; i++) {
		if (taken[i]) continue;

		// Current arc
		bool EllipseEqValid = false;
		EllipseEquation Eq;
		double EllipseFitError;

		double R = arcs[i].r;
		int Turn = arcs[i].turn;
		int NoPixels = arcs[i].noPixels;

		int SX = arcs[i].sx;
		int SY = arcs[i].sy;
		int EX = arcs[i].ex;
		int EY = arcs[i].ey;

		// Take the pixels making up this arc
		int noPixels = arcs[i].noPixels;

		double *x = bm->getX();
		double *y = bm->getY();
		memcpy(x, arcs[i].x, noPixels * sizeof(double));
		memcpy(y, arcs[i].y, noPixels * sizeof(double));

		angles.clear();
		angles.set(arcs[i].sTheta, arcs[i].eTheta);

		while (1) {
			bool extendedArc = false;

			// Find other arcs to join with
			noCandidateArcs = 0;

			for (int j = i + 1; j<noArcs; j++) {
				if (taken[j]) continue;
				if (arcs[j].segmentNo != arcs[i].segmentNo) continue;
				if (arcs[j].turn != Turn) continue;

				double minR = MIN(R, arcs[j].r);
				double radiusDiffThreshold = minR*2.5;

				double diff = fabs(R - arcs[j].r);
				if (diff > radiusDiffThreshold) continue;

				// If 75% of the current arc overlaps with the existing arc, then ignore this arc
				if (angles.overlap(arcs[j].sTheta, arcs[j].eTheta) >= 0.75) continue;

				// Compute the distances
				// 1: (SX, SY)-(sx, sy)
				double dx = SX - arcs[j].sx;
				double dy = SY - arcs[j].sy;
				double d = sqrt(dx*dx + dy*dy);
				int which = 1;

				// 2: (SX, SY)-(ex, ey)
				dx = SX - arcs[j].ex;
				dy = SY - arcs[j].ey;
				double d2 = sqrt(dx*dx + dy*dy);
				if (d2 < d) { d = d2; which = 2; }

				// 3: (EX, EY)-(sx, sy)
				dx = EX - arcs[j].sx;
				dy = EY - arcs[j].sy;
				d2 = sqrt(dx*dx + dy*dy);
				if (d2 < d) { d = d2; which = 3; }

				// 4: (EX, EY)-(ex, ey)
				dx = EX - arcs[j].ex;
				dy = EY - arcs[j].ey;
				d2 = sqrt(dx*dx + dy*dy);
				if (d2 < d) { d = d2; which = 4; }

				// Endpoints must be very close
				double maxDistanceBetweenEndpoints = 5; //10; 
				if (d > maxDistanceBetweenEndpoints) continue;

				// Add to candidate arcs in sorted order. User insertion sort
				int index = noCandidateArcs - 1;
				while (index >= 0) {
					if (candidateArcs[index].dist < d) break;

					candidateArcs[index + 1] = candidateArcs[index];
					index--;
				} //end-while

				  // Add the new candidate arc to the candidate list
				index++;
				candidateArcs[index].arcNo = j;
				candidateArcs[index].which = which;
				candidateArcs[index].dist = d;
				noCandidateArcs++;
			} //end-for

			  // Try to join the current arc with the candidate arc (if there is one)
			if (noCandidateArcs > 0) {
				for (int j = 0; j<noCandidateArcs; j++) {
					int CandidateArcNo = candidateArcs[j].arcNo;
					int Which = candidateArcs[j].which;

					int noPixelsSave = noPixels;
					memcpy(x + noPixels, arcs[CandidateArcNo].x, arcs[CandidateArcNo].noPixels * sizeof(double));
					memcpy(y + noPixels, arcs[CandidateArcNo].y, arcs[CandidateArcNo].noPixels * sizeof(double));
					noPixels += arcs[CandidateArcNo].noPixels;

					// Directly fit an ellipse
					EllipseEquation eq;
					double ellipseFitError = 1e10;
					if (EllipseFit(x, y, noPixels, &eq)) ellipseFitError = ComputeEllipseError(&eq, x, y, noPixels);

					if (ellipseFitError > ELLIPSE_ERROR) {
						// No match. Continue with the next candidate
						noPixels = noPixelsSave;

					}
					else {
						// Match. Take it
						extendedArc = true;
						EllipseEqValid = true;
						Eq = eq;
						EllipseFitError = ellipseFitError;
						NoPixels = noPixels;

						taken[CandidateArcNo] = true;
						taken[i] = true;

						R = (R + arcs[CandidateArcNo].r) / 2.0;

						angles.set(arcs[CandidateArcNo].sTheta, arcs[CandidateArcNo].eTheta);

						// Update the end points of the new arc
						switch (Which) {
							// (SX, SY)-(sy, sy)
						case 1: SX = EX, SY = EY; EX = arcs[CandidateArcNo].ex; EY = arcs[CandidateArcNo].ey;
							if (Turn == 1) Turn = -1; else Turn = 1; // reverse the turn direction
							break;

							// (SX, SY)-(ex, ey)
						case 2: SX = EX, SY = EY; EX = arcs[CandidateArcNo].sx; EY = arcs[CandidateArcNo].sy;
							if (Turn == 1) Turn = -1; else Turn = 1; // reverse the turn direction
							break;

							// (EX, EY)-(sx, sy)
						case 3: EX = arcs[CandidateArcNo].ex; EY = arcs[CandidateArcNo].ey; break;

							// (EX, EY)-(ex, ey)
						case 4: EX = arcs[CandidateArcNo].sx; EY = arcs[CandidateArcNo].sy; break;
						} //end-switch

						break; // Do not look at the other candidates
					} //end-if
				} //end-for
			} //end-if

			if (extendedArc == false) break;
		} //end-while

		if (EllipseEqValid == false) {
			// Add to arcs
			edarcs3->arcs[edarcs3->noArcs++] = arcs[i];

		}
		else {
			// Add the current OR the extended arc to the new arcs
			double sTheta, eTheta;
			angles.computeStartEndTheta(sTheta, eTheta);

			double XC, YC, R, CircleFitError;
			CircleFit(x, y, NoPixels, &XC, &YC, &R, &CircleFitError);

			double coverage = ArcLength(sTheta, eTheta) / TWOPI;
			if ((coverage >= FULL_CIRCLE_RATIO && CircleFitError <= LONG_ARC_ERROR))
				addCircle(circles1, noCircles1, XC, YC, R, CircleFitError, x, y, NoPixels);
			else
				addArc(edarcs3->arcs, edarcs3->noArcs, XC, YC, R, CircleFitError, sTheta, eTheta, Turn, arcs[i].segmentNo, &Eq, EllipseFitError, SX, SY, EX, EY, x, y, NoPixels, angles.overlapRatio());

			// Move buffer pointers
			bm->move(NoPixels);
		} //end-if
	} //end-for

	delete[] taken;
	delete[] candidateArcs;
}